

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmax_distance.cpp
# Opt level: O3

int __thiscall
KMaxDistance::putValToItsSortedPlace(KMaxDistance *this,double val,double *vals,int numVals)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  double *pdVar20;
  ulong uVar21;
  ulong uVar22;
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  
  if (numVals < 1 || val <= vals[(long)numVals + -1]) {
    return 0;
  }
  uVar19 = (ulong)(uint)numVals;
  if (val <= *vals) {
    uVar18 = 0;
    do {
      if (uVar19 - 1 == uVar18) {
        return 0;
      }
      lVar16 = uVar18 + 1;
      uVar18 = uVar18 + 1;
    } while (val <= vals[lVar16]);
    uVar17 = (uint)(uVar18 < uVar19);
  }
  else {
    uVar17 = 1;
    uVar18 = 0;
  }
  if ((int)uVar18 < numVals + -1) {
    auVar23 = vpmovsxbq_avx512f(ZEXT816(0x1020304050607));
    auVar24 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    uVar21 = uVar19 - 2;
    if ((long)uVar18 < (long)(uVar19 - 2)) {
      uVar21 = uVar18;
    }
    pdVar20 = vals + (uVar19 - 8);
    auVar25 = vpbroadcastq_avx512f();
    uVar22 = 0;
    auVar25 = vpermq_avx512f(auVar23,auVar25);
    do {
      auVar26 = vpbroadcastq_avx512f();
      uVar22 = uVar22 + 8;
      auVar26 = vporq_avx512f(auVar26,auVar24);
      auVar26 = vpermq_avx512f(auVar23,auVar26);
      uVar8 = vpcmpuq_avx512f(auVar26,auVar25,2);
      dVar9 = *pdVar20;
      dVar10 = pdVar20[1];
      dVar11 = pdVar20[2];
      dVar12 = pdVar20[3];
      dVar13 = pdVar20[4];
      dVar14 = pdVar20[5];
      dVar15 = pdVar20[6];
      bVar1 = (bool)((byte)uVar8 & 1);
      bVar2 = (bool)((byte)(uVar8 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar8 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar8 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar8 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar8 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar8 >> 6) & 1);
      *pdVar20 = (double)((ulong)bVar1 * (ulong)((byte)uVar8 & 1) * (long)pdVar20[-1] |
                         (ulong)!bVar1 * (long)*pdVar20);
      pdVar20[1] = (double)((ulong)bVar2 * (ulong)((byte)(uVar8 >> 1) & 1) * (long)dVar9 |
                           (ulong)!bVar2 * (long)pdVar20[1]);
      pdVar20[2] = (double)((ulong)bVar3 * (ulong)((byte)(uVar8 >> 2) & 1) * (long)dVar10 |
                           (ulong)!bVar3 * (long)pdVar20[2]);
      pdVar20[3] = (double)((ulong)bVar4 * (ulong)((byte)(uVar8 >> 3) & 1) * (long)dVar11 |
                           (ulong)!bVar4 * (long)pdVar20[3]);
      pdVar20[4] = (double)((ulong)bVar5 * (ulong)((byte)(uVar8 >> 4) & 1) * (long)dVar12 |
                           (ulong)!bVar5 * (long)pdVar20[4]);
      pdVar20[5] = (double)((ulong)bVar6 * (ulong)((byte)(uVar8 >> 5) & 1) * (long)dVar13 |
                           (ulong)!bVar6 * (long)pdVar20[5]);
      pdVar20[6] = (double)((ulong)bVar7 * (ulong)((byte)(uVar8 >> 6) & 1) * (long)dVar14 |
                           (ulong)!bVar7 * (long)pdVar20[6]);
      pdVar20[7] = (double)((uVar8 >> 7) * (uVar8 >> 7) * (long)dVar15 |
                           (ulong)!SUB81(uVar8 >> 7,0) * (long)pdVar20[7]);
      pdVar20 = pdVar20 + -8;
    } while ((~uVar21 + 7 + uVar19 & 0xfffffffffffffff8) != uVar22);
  }
  vals[uVar18] = val;
  return uVar17;
}

Assistant:

int KMaxDistance::putValToItsSortedPlace( const double val, double *vals, const int numVals ){
    if ( val <= vals[numVals-1] ) return 0;
    for ( int i = 0; i < numVals; ++i ){
        if ( vals[i] >= val ) continue;
        for ( int j = numVals-1; j > i; --j ) vals[j] = vals[j-1];
        vals[i] = val;
        return 1;
    }
    return 0;
}